

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

TypeMap * __thiscall
wasm::GlobalTypeRewriter::rebuildTypes
          (TypeMap *__return_storage_ptr__,GlobalTypeRewriter *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  __node_base_ptr __k;
  TypeBuilder *this_00;
  __node_base_ptr *pp_Var1;
  int *piVar2;
  _List_node_base *p_Var3;
  pointer pFVar4;
  pointer pHVar5;
  IteratorBase<wasm::SmallVector<wasm::HeapType,_1UL>,_wasm::SmallVector<wasm::HeapType,_1UL>::Iterator>
  IVar6;
  _List_node_base _Var7;
  pointer pSVar8;
  pointer pvVar9;
  bool open;
  int iVar10;
  Shareability share;
  HeapTypeKind HVar11;
  size_type sVar12;
  undefined4 extraout_var;
  iterator iVar13;
  mapped_type *__x;
  _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  *this_01;
  _List_node_base *p_Var14;
  pointer __dest;
  undefined4 extraout_var_00;
  uint *puVar15;
  _Storage<wasm::HeapType,_true> _Var16;
  Type TVar17;
  Type TVar18;
  Struct *pSVar19;
  HeapType HVar20;
  undefined4 extraout_var_01;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar21;
  mapped_type *pmVar22;
  Fatal *this_02;
  const_iterator __begin2;
  undefined1 auVar23 [8];
  fd_set *__writefds;
  byte extraout_DL;
  ulong extraout_RDX;
  _Hash_node_base *p_Var24;
  undefined1 auVar25 [8];
  long lVar26;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_03;
  list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *plVar27;
  iterator iVar28;
  timeval *__timeout;
  pointer pFVar29;
  uint uVar30;
  size_t sVar31;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar32;
  IteratorBase<wasm::SmallVector<wasm::HeapType,_1UL>,_wasm::SmallVector<wasm::HeapType,_1UL>::Iterator>
  IVar33;
  optional<wasm::HeapType> oVar34;
  Signature SVar35;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  undefined1 local_3a0 [8];
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  additionalSet;
  undefined1 auStack_308 [8];
  optional<wasm::HeapType> super;
  undefined1 local_2f0 [32];
  pointer local_2d0;
  pointer puStack_2c8;
  pointer local_2c0;
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  *local_2b8;
  GlobalTypeRewriter *local_2b0;
  vector<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  local_2a8 [12];
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_178;
  undefined1 auStack_158 [8];
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  privateSupertypes;
  undefined1 auStack_138 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sorted;
  undefined1 auStack_118 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> order;
  undefined1 auStack_f8 [8];
  BuildResult buildResults;
  TypeBuilder aTStack_c8 [2];
  undefined1 local_b8 [8];
  anon_class_8_1_8991fb9c map;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _List_node_base *local_90;
  iterator __end1;
  TypeMap *oldToNewTypes;
  undefined1 auStack_78 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> elements;
  undefined1 auStack_58 [8];
  Graph indexGraph;
  
  __end1._M_node = (_List_node_base *)__return_storage_ptr__;
  wasm::ModuleUtils::collectHeapTypeInfo
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_3a0,
             this->wasm,UsedIRTypes,FindVisibility);
  __timeout = (timeval *)auStack_f8;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&typeInfo.List.
                 super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                 ._M_impl._M_node._M_size,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,auStack_308,__timeout,auStack_78);
  auStack_158 = (undefined1  [8])0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_158,(size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
  pp_Var1 = &typeInfo.Map._M_h._M_single_bucket;
  for (p_Var24 = typeInfo.Map._M_h._M_single_bucket; auVar23 = auStack_158,
      p_Var24 != (_Hash_node_base *)pp_Var1; p_Var24 = p_Var24->_M_nxt) {
    __k = p_Var24 + 2;
    if ((*(int *)((long)&p_Var24[3]._M_nxt + 4) == 2) ||
       (sVar12 = std::
                 _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&typeInfo.List.
                             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                             ._M_impl._M_node._M_size,(key_type *)__k), sVar12 != 0)) {
      auStack_f8 = (undefined1  [8])0x0;
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = 0x10;
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_
           = 0;
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _16_8_ = 0;
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
           '\0';
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ = 0
      ;
      std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>::
      pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>,_true>
                ((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auStack_308,
                 (HeapType *)__k,(SmallVector<wasm::HeapType,_1UL> *)auStack_f8);
      std::
      vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
      ::emplace_back<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>
                ((vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
                  *)auStack_158,
                 (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auStack_308);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f0);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 (buildResults.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_u._M_first._M_storage._M_storage + 8));
      iVar10 = (*this->_vptr_GlobalTypeRewriter[7])(this,__k->_M_nxt);
      _Var7 = _auStack_308;
      auStack_308._4_4_ = extraout_var;
      auStack_308._0_4_ = iVar10;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ =
           _Var7._M_prev._1_7_;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._0_1_ = extraout_DL;
      if (((extraout_DL & 1) != 0) &&
         (((iVar13 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::find
                               ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *
                                )local_3a0,(HeapType *)auStack_308),
           iVar13._M_node != (_List_node_base *)pp_Var1 &&
           (*(int *)((long)&iVar13._M_node[1]._M_prev + 4) == 2)) ||
          (sVar12 = std::
                    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)&typeInfo.List.
                                super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                ._M_impl._M_node._M_size,(key_type *)auStack_308), sVar12 != 0)))) {
        SmallVector<wasm::HeapType,_1UL>::push_back
                  (&privateSupertypes.
                    super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].second,(HeapType *)auStack_308);
      }
    }
  }
  sorted.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_138 = (undefined1  [8])0x0;
  sorted.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->wasm->typeIndices)._M_h._M_element_count == 0) {
    TopologicalSort::
    sortOfImpl<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(&)(const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&),_wasm::TopologicalSort::sort>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_308,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )auStack_158,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )privateSupertypes.
                 super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    this_03 = (_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_308;
  }
  else {
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         &(privateSupertypes.
           super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first;
    auStack_f8 = (undefined1  [8])aTStack_c8;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         1;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
         0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
         = 0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_4_ =
         0x3f800000;
    aTStack_c8[0].impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    for (auVar25 = auStack_158;
        auVar25 !=
        (undefined1  [8])
        order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; auVar25 = (undefined1  [8])((long)auVar25 + 0x30)
        ) {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._0_4_ =
           (int)((ulong)((long)elements.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_78) >> 3);
      auStack_308 = (undefined1  [8])
                    (((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auVar25)->
                    first).id;
      pVar32 = std::
               _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                         ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)auStack_f8,auStack_308);
      if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("inserted.second && \"unexpected repeat element\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                      ,0x3e,
                      "decltype(auto) wasm::TopologicalSort::sortOfImpl(It, It, Args...) [It = __gnu_cxx::__normal_iterator<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>> *, std::vector<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>>>>, SortT = std::vector<unsigned int> (&)(const std::vector<std::vector<unsigned int>> &, (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)), Sort = wasm::TopologicalSort::minSort, Args = <(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>]"
                     );
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_78,
                 (value_type *)
                 ((long)pVar32.first.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                 + 8));
    }
    auStack_58 = (undefined1  [8])0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reserve((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58,
              (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3);
    for (; auVar23 !=
           (undefined1  [8])
           order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
        auVar23 = (undefined1  [8])((long)auVar23 + 0x30)) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::emplace_back<>((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)auStack_58);
      IVar33 = (IteratorBase<wasm::SmallVector<wasm::HeapType,_1UL>,_wasm::SmallVector<wasm::HeapType,_1UL>::Iterator>
                )SmallVector<wasm::HeapType,_1UL>::end
                           (&((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)
                             auVar23)->second);
      local_90 = (_List_node_base *)
                 &(((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auVar23)->
                  second).fixed;
      lVar26 = -8;
      for (sVar31 = 0;
          pvVar9 = indexGraph.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, IVar6.index = sVar31,
          IVar6.parent = &((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auVar23)
                          ->second, IVar33 != IVar6; sVar31 = sVar31 + 1) {
        p_Var14 = (_List_node_base *)
                  ((long)&((((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)
                            auVar23)->second).flexible.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id + lVar26);
        if (sVar31 == 0) {
          p_Var14 = local_90;
        }
        __x = std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)auStack_f8,(key_type *)p_Var14);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar9 + -1,__x);
        lVar26 = lVar26 + 8;
      }
    }
    auStack_118 = (undefined1  [8])0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_118,
               (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3);
    auStack_308 = (undefined1  [8])auStack_58;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&super,
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) / 0x18,
               (allocator_type *)local_b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2f0 + 8),
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) / 0x18,
               (allocator_type *)local_b8);
    local_2c0 = (pointer)0x0;
    local_2a8[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = (_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               *)(((long)indexGraph.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) / 0x18);
    local_2d0 = (pointer)0x0;
    puStack_2c8 = (pointer)0x0;
    local_2b8 = (vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 *)auStack_158;
    local_2a8[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auVar23 = auStack_58;
    local_2b0 = this;
    if ((undefined1  [8])
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
      for (; auVar23 !=
             (undefined1  [8])
             indexGraph.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
          auVar23 = (undefined1  [8])&((_List_node_base *)((long)auVar23 + 0x10))->_M_prev) {
        p_Var14 = ((_List_node_base *)auVar23)->_M_next;
        p_Var3 = ((_List_node_base *)auVar23)->_M_prev;
        for (; p_Var14 != p_Var3; p_Var14 = (_List_node_base *)((long)&p_Var14->_M_next + 4)) {
          piVar2 = (int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::HeapType>._M_payload +
                          (ulong)*(uint *)&p_Var14->_M_next * 4);
          *piVar2 = *piVar2 + 1;
        }
      }
      if ((_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
           *)0xaaaaaaaaaaaaaaa < this_01) {
        std::__throw_length_error("vector::reserve");
      }
      __dest = std::
               _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
               ::_M_allocate(this_01,(size_t)indexGraph.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
      pSVar8 = local_2a8[0].
               super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)local_2a8[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2a8[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        memmove(__dest,local_2a8[0].
                       super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                (long)local_2a8[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2a8[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar26 = (long)local_2a8[0].
                     super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8;
      std::
      _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
      ::_M_deallocate((_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                       *)pSVar8,(pointer)(lVar26 / 0xc),lVar26 % 0xc);
      local_2a8[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + (long)this_01;
      local_b8 = (undefined1  [8])0x0;
      map.this._0_4_ = 0;
      local_2a8[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start = __dest;
      local_2a8[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_finish = __dest;
      std::
      vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
      ::push_back(local_2a8,(value_type *)local_b8);
      pSVar8 = local_2a8[0].
               super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (uVar30 = 0;
          (ulong)uVar30 <
          (ulong)(((long)indexGraph.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) / 0x18);
          uVar30 = uVar30 + 1) {
        if (*(int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload +
                    (ulong)uVar30 * 4) == 0) {
          TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
          ::pushChoice((TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
                        *)auStack_308,uVar30);
          pSVar8[-1].count = pSVar8[-1].count + 1;
        }
      }
      while( true ) {
        __writefds = (fd_set *)
                     ((long)indexGraph.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58);
        if ((ulong)((long)__writefds / 0x18) <=
            (ulong)(((long)local_2a8[0].
                           super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2a8[0].
                          super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc)) break;
        iVar10 = TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
                 ::Selector::select(local_2a8[0].
                                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1,(int)auStack_308
                                    ,(fd_set *)((long)__writefds % 0x18),__writefds,
                                    (fd_set *)auStack_58,__timeout);
        local_b8 = (undefined1  [8])CONCAT44(extraout_var_00,iVar10);
        map.this._0_4_ = 0;
        std::
        vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
        ::push_back(local_2a8,(value_type *)local_b8);
      }
      TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
      ::Selector::select(local_2a8[0].
                         super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,(int)auStack_308,
                         (fd_set *)((long)__writefds % 0x18),__writefds,(fd_set *)auStack_58,
                         __timeout);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2f0 + 8));
    TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
    ::~TopologicalOrdersImpl
              ((TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
                *)auStack_308);
    for (p_Var14 = (_List_node_base *)local_a8._M_impl.super__Vector_impl_data._M_start;
        p_Var14 != (_List_node_base *)local_a8._M_impl.super__Vector_impl_data._M_finish;
        p_Var14 = (_List_node_base *)((long)&p_Var14->_M_next + 4)) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_118,
                 (HeapType *)((ulong)*(uint *)&p_Var14->_M_next * 8 + (long)auStack_78));
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
    this_03 = &local_178;
    local_178._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_118;
    local_178._M_impl.super__Vector_impl_data._M_finish =
         order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_178._M_impl.super__Vector_impl_data._M_end_of_storage =
         order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_118 = (undefined1  [8])0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_118);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_78);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_f8);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_138,this_03);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(this_03);
  std::
  __reverse<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            (auStack_138,
             sorted.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start);
  pHVar5 = sorted.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar30 = 0;
  for (auVar23 = auStack_138; auVar23 != (undefined1  [8])pHVar5;
      auVar23 = (undefined1  [8])((long)auVar23 + 8)) {
    auStack_308 = (undefined1  [8])((pointer)auVar23)->id;
    puVar15 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::operator[]
                        (&this->typeIndices,(HeapType *)auStack_308);
    *puVar15 = uVar30;
    uVar30 = uVar30 + 1;
  }
  sVar31 = (this->typeIndices).Map._M_h._M_element_count;
  if (sVar31 == 0) {
    __end1._M_node[2]._M_next = (_List_node_base *)0x0;
    (__end1._M_node)->_M_next = __end1._M_node + 3;
    (__end1._M_node)->_M_prev = (_List_node_base *)0x1;
    __end1._M_node[1]._M_next = (_List_node_base *)0x0;
    __end1._M_node[1]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&__end1._M_node[2]._M_next = 0x3f800000;
    __end1._M_node[2]._M_prev = (_List_node_base *)0x0;
    __end1._M_node[3]._M_next = (_List_node_base *)0x0;
    iVar28._M_node = __end1._M_node;
  }
  else {
    this_00 = &this->typeBuilder;
    TypeBuilder::grow(this_00,sVar31);
    sVar31 = TypeBuilder::size(this_00);
    oldToNewTypes = (TypeMap *)0x0;
    TypeBuilder::createRecGroup(this_00,0,sVar31);
    local_90 = (_List_node_base *)&(this->typeIndices).List;
    plVar27 = (list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
               *)local_90;
    local_b8 = (undefined1  [8])this;
    while (p_Var14 = (plVar27->
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next, p_Var14 != local_90) {
      auStack_118 = (undefined1  [8])p_Var14[1]._M_next;
      order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Var14[1]._M_prev;
      local_178._M_impl.super__Vector_impl_data._M_start = (pointer)this;
      order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)p_Var14;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_118;
      if ((ulong)auStack_118 < (_List_node_base *)0x7d) {
        __assert_fail("!type.isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x2df,
                      "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)]"
                     );
      }
      oVar34 = HeapType::getDeclaredSuperType((HeapType *)&local_a8);
      if (((undefined1  [16])
           oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        _Var16._M_value =
             rebuildTypes::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&local_178,
                        oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var16;
        TypeBuilder::setSubType(this_00,(size_t)oldToNewTypes,oVar34);
      }
      oVar34 = HeapType::getDescriptorType((HeapType *)&local_a8);
      if (((undefined1  [16])
           oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        _Var16._M_value =
             rebuildTypes::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&local_178,
                        oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var16;
        TypeBuilder::setDescriptor(this_00,(size_t)oldToNewTypes,desc);
      }
      oVar34 = HeapType::getDescribedType((HeapType *)&local_a8);
      if (((undefined1  [16])
           oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        _Var16._M_value =
             rebuildTypes::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&local_178,
                        oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var16;
        TypeBuilder::setDescribed(this_00,(size_t)oldToNewTypes,desc_00);
      }
      open = HeapType::isOpen((HeapType *)&local_a8);
      TypeBuilder::setOpen(this_00,(size_t)oldToNewTypes,open);
      share = HeapType::getShared((HeapType *)&local_a8);
      TypeBuilder::setShared(this_00,(size_t)oldToNewTypes,share);
      elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_178;
      auStack_58 = (undefined1  [8])auStack_78;
      auStack_78 = (undefined1  [8])this_00;
      indexGraph.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      HVar11 = HeapType::getKind((HeapType *)&local_a8);
      switch(HVar11) {
      case Basic:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                           ,0x31b);
      case Func:
        SVar35 = HeapType::getSignature((HeapType *)&local_a8);
        TVar17 = TypeBuilder::
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)auStack_58,SVar35.params.id);
        TVar18 = TypeBuilder::
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)auStack_58,SVar35.results.id);
        SVar35.results.id = TVar18.id;
        SVar35.params.id = TVar17.id;
        TypeBuilder::setHeapType(this_00,(size_t)oldToNewTypes,SVar35);
        break;
      case Struct:
        pSVar19 = HeapType::getStruct((HeapType *)&local_a8);
        _auStack_308 = (_List_node_base)ZEXT816(0);
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308,
                   (long)(pSVar19->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pSVar19->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4);
        pFVar4 = (pSVar19->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar29 = (pSVar19->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start; pFVar29 != pFVar4; pFVar29 = pFVar29 + 1) {
          auStack_f8 = (undefined1  [8])(pFVar29->type).id;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _0_4_ = pFVar29->packedType;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _4_4_ = pFVar29->mutable_;
          auStack_f8 = (undefined1  [8])
                       TypeBuilder::
                       copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                       ::anon_class_16_2_ecc023e0::operator()
                                 ((anon_class_16_2_ecc023e0 *)auStack_58,(Type)auStack_f8);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308,
                     (value_type *)auStack_f8);
        }
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_f8,
                   (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308);
        TypeBuilder::setHeapType(this_00,(size_t)oldToNewTypes,(Struct *)auStack_f8);
        std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                  ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_f8);
        std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                  ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308);
        break;
      case Array:
        HeapType::getArray((HeapType *)auStack_308);
        _Var16 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
        auStack_308 = (undefined1  [8])
                      TypeBuilder::
                      copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                      ::anon_class_16_2_ecc023e0::operator()
                                ((anon_class_16_2_ecc023e0 *)auStack_58,(Type)auStack_308);
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload = _Var16;
        TypeBuilder::setHeapType(this_00,(size_t)oldToNewTypes,(Array *)auStack_308);
        break;
      case Cont:
        HVar20.id = (uintptr_t)HeapType::getContinuation((HeapType *)&local_a8);
        HVar20 = rebuildTypes::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)&local_178,HVar20);
        TypeBuilder::setHeapType(this_00,(size_t)oldToNewTypes,(Continuation)HVar20.id);
      }
      HVar11 = HeapType::getKind((HeapType *)auStack_118);
      switch(HVar11) {
      case Basic:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                           ,0xa0);
      case Func:
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        auStack_78 = (undefined1  [8])
                     TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_f8);
        _auStack_308 = (_List_node_base)HeapType::getSignature((HeapType *)auStack_78);
        (*this->_vptr_GlobalTypeRewriter[5])(this,auStack_118,auStack_308);
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        TypeBuilder::Entry::operator=((Entry *)auStack_f8,(Signature)_auStack_308);
        break;
      case Struct:
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        auStack_78 = (undefined1  [8])
                     TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_f8);
        pSVar19 = HeapType::getStruct((HeapType *)auStack_78);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308,&pSVar19->fields
                  );
        (*this->_vptr_GlobalTypeRewriter[2])
                  (this,auStack_118,
                   (_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308);
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        TypeBuilder::Entry::operator=((Entry *)auStack_f8,(Struct *)auStack_308);
        std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                  ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_308);
        break;
      case Array:
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        auStack_78 = (undefined1  [8])
                     TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_f8);
        HeapType::getArray((HeapType *)auStack_308);
        (*this->_vptr_GlobalTypeRewriter[3])(this,auStack_118,(HeapType *)auStack_308);
        additionalSet._M_h._M_single_bucket = (__node_base_ptr)auStack_308;
        auStack_f8 = (undefined1  [8])this_00;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = oldToNewTypes;
        TypeBuilder::Entry::operator=
                  ((Entry *)auStack_f8,(Array *)&additionalSet._M_h._M_single_bucket);
        break;
      case Cont:
        auStack_308 = (undefined1  [8])this_00;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)oldToNewTypes;
        auStack_78 = (undefined1  [8])
                     TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_308);
        auStack_f8 = (undefined1  [8])HeapType::getContinuation((HeapType *)auStack_78);
        (*this->_vptr_GlobalTypeRewriter[4])(this,auStack_118,(value_type *)auStack_f8);
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)oldToNewTypes;
        auStack_308 = (undefined1  [8])this_00;
        TypeBuilder::Entry::operator=((Entry *)auStack_308,(Continuation)auStack_f8);
      }
      auVar23 = auStack_118;
      HVar20.id._0_4_ = (*this->_vptr_GlobalTypeRewriter[7])();
      HVar20.id._4_4_ = extraout_var_01;
      if ((extraout_RDX & 1) == 0) {
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)oldToNewTypes;
        auStack_308 = (undefined1  [8])this_00;
        other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
        other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)auVar23;
        TypeBuilder::Entry::subTypeOf((Entry *)auStack_308,other_00);
      }
      else {
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)oldToNewTypes;
        auStack_308 = (undefined1  [8])this_00;
        _Var16._M_value =
             rebuildTypes::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)local_b8,HVar20);
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var16;
        TypeBuilder::Entry::subTypeOf((Entry *)auStack_308,other);
      }
      (*this->_vptr_GlobalTypeRewriter[6])(this,this_00,oldToNewTypes,auStack_118);
      oldToNewTypes = (TypeMap *)(ulong)((int)oldToNewTypes + 1);
      plVar27 = (list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 *)order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
    }
    TypeBuilder::build((BuildResult *)auStack_f8,this_00);
    if (buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\x01') {
      Fatal::Fatal((Fatal *)auStack_308);
      std::operator<<((ostream *)
                      &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged,
                      "Internal GlobalTypeRewriter build error: ");
      this_02 = Fatal::operator<<((Fatal *)auStack_308,(ErrorReason *)&buildResults);
      std::operator<<((ostream *)&this_02->field_0x10," at index ");
      Fatal::operator<<(this_02,(unsigned_long *)auStack_f8);
      Fatal::~Fatal((Fatal *)auStack_308);
    }
    pvVar21 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)auStack_f8);
    (__end1._M_node)->_M_next = __end1._M_node + 3;
    (__end1._M_node)->_M_prev = (_List_node_base *)0x1;
    __end1._M_node[1]._M_next = (_List_node_base *)0x0;
    __end1._M_node[1]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&__end1._M_node[2]._M_next = 0x3f800000;
    __end1._M_node[2]._M_prev = (_List_node_base *)0x0;
    __end1._M_node[3]._M_next = (_List_node_base *)0x0;
    p_Var14 = local_90;
    while (iVar28._M_node = __end1._M_node, p_Var14 = p_Var14->_M_next, p_Var14 != local_90) {
      p_Var3 = p_Var14[1]._M_prev;
      _auStack_308 = p_Var14[1];
      pHVar5 = (pvVar21->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pmVar22 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)__end1._M_node,(key_type *)auStack_308);
      pmVar22->id = pHVar5[(ulong)p_Var3 & 0xffffffff].id;
    }
    mapTypeNamesAndIndices(this,(TypeMap *)__end1._M_node);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_f8);
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_138);
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::~vector((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_158);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&typeInfo.List.
                    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                    ._M_impl._M_node._M_size);
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::~InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_3a0);
  return (TypeMap *)iVar28._M_node;
}

Assistant:

GlobalTypeRewriter::TypeMap GlobalTypeRewriter::rebuildTypes(
  const std::vector<HeapType>& additionalPrivateTypes) {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder.
  auto typeInfo = ModuleUtils::collectHeapTypeInfo(
    wasm,
    ModuleUtils::TypeInclusion::UsedIRTypes,
    ModuleUtils::VisibilityHandling::FindVisibility);

  std::unordered_set<HeapType> additionalSet(additionalPrivateTypes.begin(),
                                             additionalPrivateTypes.end());

  std::vector<std::pair<HeapType, SmallVector<HeapType, 1>>> privateSupertypes;
  privateSupertypes.reserve(typeInfo.size());
  for (auto& [type, info] : typeInfo) {
    if (info.visibility != ModuleUtils::Visibility::Private &&
        !additionalSet.count(type)) {
      continue;
    }
    privateSupertypes.push_back({type, {}});

    if (auto super = getDeclaredSuperType(type)) {
      auto it = typeInfo.find(*super);
      // Record the supertype only if it is among the private types.
      if ((it != typeInfo.end() &&
           it->second.visibility == ModuleUtils::Visibility::Private) ||
          additionalSet.count(*super)) {
        privateSupertypes.back().second.push_back(*super);
      }
    }
  }

  // Topological sort to have subtypes first. This is the opposite of the
  // order we need, so the comparison is the opposite of what we ultimately
  // want.
  std::vector<HeapType> sorted;
  if (wasm.typeIndices.empty()) {
    sorted = TopologicalSort::sortOf(privateSupertypes.begin(),
                                     privateSupertypes.end());
  } else {
    sorted =
      TopologicalSort::minSortOf(privateSupertypes.begin(),
                                 privateSupertypes.end(),
                                 [&](Index a, Index b) {
                                   auto typeA = privateSupertypes[a].first;
                                   auto typeB = privateSupertypes[b].first;
                                   // Preserve type order.
                                   auto itA = wasm.typeIndices.find(typeA);
                                   auto itB = wasm.typeIndices.find(typeB);
                                   bool hasA = itA != wasm.typeIndices.end();
                                   bool hasB = itB != wasm.typeIndices.end();
                                   if (hasA != hasB) {
                                     // Types with preserved indices must be
                                     // sorted before (after in this reversed
                                     // comparison) types without indices to
                                     // maintain transitivity.
                                     return !hasA;
                                   }
                                   if (hasA && *itA != *itB) {
                                     return !(itA->second < itB->second);
                                   }
                                   // Break ties by the arbitrary order we
                                   // have collected the types in.
                                   return a > b;
                                 });
  }
  std::reverse(sorted.begin(), sorted.end());
  Index i = 0;
  for (auto type : sorted) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return {};
  }

  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  auto map = [&](HeapType type) -> HeapType {
    if (auto it = typeIndices.find(type); it != typeIndices.end()) {
      return typeBuilder[it->second];
    }
    return type;
  };
  for (auto [type, _] : typeIndices) {
    typeBuilder[i].copy(type, map);
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        auto newSig = HeapType(typeBuilder[i]).getSignature();
        modifySignature(type, newSig);
        typeBuilder[i] = newSig;
        break;
      }
      case HeapTypeKind::Struct: {
        auto newStruct = HeapType(typeBuilder[i]).getStruct();
        modifyStruct(type, newStruct);
        typeBuilder[i] = newStruct;
        break;
      }
      case HeapTypeKind::Array: {
        auto newArray = HeapType(typeBuilder[i]).getArray();
        modifyArray(type, newArray);
        typeBuilder[i] = newArray;
        break;
      }
      case HeapTypeKind::Cont: {
        auto newCont = HeapType(typeBuilder[i]).getContinuation();
        modifyContinuation(type, newCont);
        typeBuilder[i] = newCont;
        break;
      }
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }

    if (auto super = getDeclaredSuperType(type)) {
      typeBuilder[i].subTypeOf(map(*super));
    } else {
      typeBuilder[i].subTypeOf(std::nullopt);
    }

    modifyTypeBuilderEntry(typeBuilder, i, type);
    ++i;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // TODO: It is possible that the newly built rec group matches some public rec
  // group. If that is the case, we need to try a different permutation of the
  // types or add a brand type to distinguish the private types.

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }
  mapTypeNamesAndIndices(oldToNewTypes);
  return oldToNewTypes;
}